

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

vector<User,_std::allocator<User>_> * __thiscall
Database::getAllUsers(vector<User,_std::allocator<User>_> *__return_storage_ptr__,Database *this)

{
  int iVar1;
  DatabaseException *this_00;
  char *errorMsg;
  string query;
  string error;
  allocator local_91;
  char *local_90;
  char *local_88 [2];
  char local_78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_90 = (char *)0x0;
  (__return_storage_ptr__->super__Vector_base<User,_std::allocator<User>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<User,_std::allocator<User>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<User,_std::allocator<User>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"select * from users;","");
  iVar1 = sqlite3_exec(this->database,local_88[0],add_user_callback,__return_storage_ptr__,&local_90
                      );
  if (iVar1 == 0) {
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_48,local_90,&local_91);
  sqlite3_free(local_90);
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_68,"Error while getting all users: ",&local_48);
  DatabaseException::DatabaseException(this_00,&local_68);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

std::vector<User> Database::getAllUsers()
{
	char* errorMsg = nullptr;
	std::vector<User> result;
	std::string query = "select * from users;";

	int retval = sqlite3_exec(database, query.c_str(), add_user_callback, &result, &errorMsg);

	if(retval != SQLITE_OK)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while getting all users: " + error);
	}
	else
	{
		return result;
	}
}